

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O2

void TestConstExpr::ConstExprTestT<unsigned_long_long>(void)

{
  ConstTestT<unsigned_long_long>();
  ComparisonTestT<unsigned_long_long>();
  ConstCastTestT<unsigned_long_long>();
  return;
}

Assistant:

void ConstExprTestT()
	{
		ConstTestT<T>();
		ComparisonTestT<T>();
		ConstCastTestT<T>();

#if CPLUSPLUS_STD == CPLUSPLUS_14
		StaticAssertTest<T>();
		TestSignedOnly();

		ConstAddT<T>();
		ConstSubtractT<T>();
		ConstMultiplyT<T>();
#endif
	}